

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::InstanceIntersectorK<8>_>,_false>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  NodeRef nodeRef;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  undefined1 (*pauVar15) [32];
  ulong uVar16;
  Primitive *prim;
  bool bVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar35 [64];
  Precalculations pre;
  vint8 bi;
  vbool<8> valid_leaf;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5951;
  RayHitK<8> *local_5950;
  RayQueryContext *local_5948;
  undefined1 local_5940 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_5920;
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 uStack_5810;
  ulong local_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  uVar16 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar16 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar21 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
      auVar21 = vpcmpeqd_avx2((undefined1  [32])valid_i->field_0,auVar21);
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') {
        auVar22 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),
                             SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar32 = ZEXT3264(local_4680);
        local_5860 = vblendvps_avx(local_4680,auVar22,auVar21);
        auVar33 = ZEXT3264(local_5860);
        auVar21 = *(undefined1 (*) [32])(ray + 0x20);
        auVar22 = *(undefined1 (*) [32])(ray + 0x40);
        uStack_5810 = 0xfffffffffffffff8;
        local_5808[0] = uVar16;
        local_4660 = local_5860;
        if (uVar16 != 0xfffffffffffffff8) {
          auVar27._8_4_ = 0x7fffffff;
          auVar27._0_8_ = 0x7fffffff7fffffff;
          auVar27._12_4_ = 0x7fffffff;
          auVar27._16_4_ = 0x7fffffff;
          auVar27._20_4_ = 0x7fffffff;
          auVar27._24_4_ = 0x7fffffff;
          auVar27._28_4_ = 0x7fffffff;
          auVar20 = vandps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar27);
          auVar30._8_4_ = 0x219392ef;
          auVar30._0_8_ = 0x219392ef219392ef;
          auVar30._12_4_ = 0x219392ef;
          auVar30._16_4_ = 0x219392ef;
          auVar30._20_4_ = 0x219392ef;
          auVar30._24_4_ = 0x219392ef;
          auVar30._28_4_ = 0x219392ef;
          auVar20 = vcmpps_avx(auVar20,auVar30,1);
          auVar23 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar30,auVar20);
          auVar20 = vandps_avx(auVar27,*(undefined1 (*) [32])(ray + 0xa0));
          auVar20 = vcmpps_avx(auVar20,auVar30,1);
          auVar18 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar30,auVar20);
          auVar20 = vandps_avx(auVar27,*(undefined1 (*) [32])(ray + 0xc0));
          auVar20 = vcmpps_avx(auVar20,auVar30,1);
          auVar27 = vrcpps_avx(auVar23);
          auVar20 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar30,auVar20);
          auVar24._8_4_ = 0x3f800000;
          auVar24._0_8_ = 0x3f8000003f800000;
          auVar24._12_4_ = 0x3f800000;
          auVar24._16_4_ = 0x3f800000;
          auVar24._20_4_ = 0x3f800000;
          auVar24._24_4_ = 0x3f800000;
          auVar24._28_4_ = 0x3f800000;
          auVar30 = vrcpps_avx(auVar18);
          auVar6 = vfnmadd213ps_fma(auVar23,auVar27,auVar24);
          auVar23 = vrcpps_avx(auVar20);
          auVar7 = vfnmadd213ps_fma(auVar18,auVar30,auVar24);
          auVar8 = vfnmadd213ps_fma(auVar20,auVar23,auVar24);
          auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar27,auVar27);
          auVar29 = ZEXT1664(auVar6);
          auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar30,auVar30);
          auVar34 = ZEXT1664(auVar7);
          auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar23,auVar23);
          auVar31 = ZEXT1664(auVar8);
          local_58e0._4_4_ = auVar6._4_4_ * -*(float *)(ray + 4);
          local_58e0._0_4_ = auVar6._0_4_ * -*(float *)ray;
          local_58e0._8_4_ = auVar6._8_4_ * -*(float *)(ray + 8);
          local_58e0._12_4_ = auVar6._12_4_ * -*(float *)(ray + 0xc);
          local_58e0._16_4_ = -*(float *)(ray + 0x10) * 0.0;
          local_58e0._20_4_ = -*(float *)(ray + 0x14) * 0.0;
          local_58e0._24_4_ = -*(float *)(ray + 0x18) * 0.0;
          local_58e0._28_4_ = auVar23._28_4_;
          auVar28 = ZEXT3264(local_58e0);
          auVar35._0_4_ = auVar7._0_4_ * -auVar21._0_4_;
          auVar35._4_4_ = auVar7._4_4_ * -auVar21._4_4_;
          auVar35._8_4_ = auVar7._8_4_ * -auVar21._8_4_;
          auVar35._12_4_ = auVar7._12_4_ * -auVar21._12_4_;
          auVar35._16_4_ = -auVar21._16_4_ * 0.0;
          auVar35._20_4_ = -auVar21._20_4_ * 0.0;
          auVar35._28_36_ = in_ZMM15._28_36_;
          auVar35._24_4_ = -auVar21._24_4_ * 0.0;
          local_5900 = auVar35._0_32_;
          auVar35 = ZEXT3264(local_5900);
          local_5840._4_4_ = auVar8._4_4_ * -auVar22._4_4_;
          local_5840._0_4_ = auVar8._0_4_ * -auVar22._0_4_;
          local_5840._8_4_ = auVar8._8_4_ * -auVar22._8_4_;
          local_5840._12_4_ = auVar8._12_4_ * -auVar22._12_4_;
          local_5840._16_4_ = -auVar22._16_4_ * 0.0;
          local_5840._20_4_ = -auVar22._20_4_ * 0.0;
          local_5840._24_4_ = -auVar22._24_4_ * 0.0;
          local_5840._28_4_ = *(uint *)(ray + 0x1c) ^ 0x80000000;
          auVar21 = vpcmpeqd_avx2(local_5840,local_5840);
          auVar22 = vpcmpeqd_avx2((undefined1  [32])valid_i->field_0,auVar21);
          puVar14 = local_5808;
          auVar21 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),
                               SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar20._8_4_ = 0xff800000;
          auVar20._0_8_ = 0xff800000ff800000;
          auVar20._12_4_ = 0xff800000;
          auVar20._16_4_ = 0xff800000;
          auVar20._20_4_ = 0xff800000;
          auVar20._24_4_ = 0xff800000;
          auVar20._28_4_ = 0xff800000;
          local_5940 = vblendvps_avx(auVar20,auVar21,auVar22);
          pauVar15 = (undefined1 (*) [32])local_4640;
          local_5880 = ZEXT1632(auVar6);
          local_58a0 = ZEXT1632(auVar7);
          local_58c0 = ZEXT1632(auVar8);
          local_5950 = ray;
          local_5948 = context;
          do {
            pauVar1 = pauVar15 + -1;
            auVar19 = ZEXT3264(*pauVar1);
            pauVar15 = pauVar15 + -1;
            auVar21 = vcmpps_avx(*pauVar1,local_5940,1);
            if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0x7f,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar21 >> 0xbf,0) != '\0') ||
                (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar21[0x1f] < '\0') {
              while ((uVar16 & 8) == 0) {
                lVar10 = 0;
                uVar9 = 0;
                auVar19 = ZEXT3264(auVar32._0_32_);
                uVar12 = 8;
                do {
                  uVar13 = *(ulong *)((uVar16 & 0xfffffffffffffff0) + lVar10 * 8);
                  if (uVar13 == 8) break;
                  uVar2 = *(undefined4 *)(uVar16 + 0x40 + lVar10 * 4);
                  auVar21._4_4_ = uVar2;
                  auVar21._0_4_ = uVar2;
                  auVar21._8_4_ = uVar2;
                  auVar21._12_4_ = uVar2;
                  auVar21._16_4_ = uVar2;
                  auVar21._20_4_ = uVar2;
                  auVar21._24_4_ = uVar2;
                  auVar21._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(uVar16 + 0x80 + lVar10 * 4);
                  auVar22._4_4_ = uVar2;
                  auVar22._0_4_ = uVar2;
                  auVar22._8_4_ = uVar2;
                  auVar22._12_4_ = uVar2;
                  auVar22._16_4_ = uVar2;
                  auVar22._20_4_ = uVar2;
                  auVar22._24_4_ = uVar2;
                  auVar22._28_4_ = uVar2;
                  auVar6 = vfmadd213ps_fma(auVar21,auVar29._0_32_,auVar28._0_32_);
                  auVar7 = vfmadd213ps_fma(auVar22,auVar34._0_32_,auVar35._0_32_);
                  uVar2 = *(undefined4 *)(uVar16 + 0xc0 + lVar10 * 4);
                  auVar23._4_4_ = uVar2;
                  auVar23._0_4_ = uVar2;
                  auVar23._8_4_ = uVar2;
                  auVar23._12_4_ = uVar2;
                  auVar23._16_4_ = uVar2;
                  auVar23._20_4_ = uVar2;
                  auVar23._24_4_ = uVar2;
                  auVar23._28_4_ = uVar2;
                  auVar8 = vfmadd213ps_fma(auVar23,auVar31._0_32_,local_5840);
                  uVar2 = *(undefined4 *)(uVar16 + 0x60 + lVar10 * 4);
                  auVar18._4_4_ = uVar2;
                  auVar18._0_4_ = uVar2;
                  auVar18._8_4_ = uVar2;
                  auVar18._12_4_ = uVar2;
                  auVar18._16_4_ = uVar2;
                  auVar18._20_4_ = uVar2;
                  auVar18._24_4_ = uVar2;
                  auVar18._28_4_ = uVar2;
                  auVar3 = vfmadd213ps_fma(auVar18,auVar29._0_32_,auVar28._0_32_);
                  uVar2 = *(undefined4 *)(uVar16 + 0xa0 + lVar10 * 4);
                  auVar25._4_4_ = uVar2;
                  auVar25._0_4_ = uVar2;
                  auVar25._8_4_ = uVar2;
                  auVar25._12_4_ = uVar2;
                  auVar25._16_4_ = uVar2;
                  auVar25._20_4_ = uVar2;
                  auVar25._24_4_ = uVar2;
                  auVar25._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(uVar16 + 0xe0 + lVar10 * 4);
                  auVar26._4_4_ = uVar2;
                  auVar26._0_4_ = uVar2;
                  auVar26._8_4_ = uVar2;
                  auVar26._12_4_ = uVar2;
                  auVar26._16_4_ = uVar2;
                  auVar26._20_4_ = uVar2;
                  auVar26._24_4_ = uVar2;
                  auVar26._28_4_ = uVar2;
                  auVar4 = vfmadd213ps_fma(auVar25,auVar34._0_32_,auVar35._0_32_);
                  auVar5 = vfmadd213ps_fma(auVar26,auVar31._0_32_,local_5840);
                  auVar21 = vpminsd_avx2(ZEXT1632(auVar6),ZEXT1632(auVar3));
                  auVar22 = vpminsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar4));
                  auVar21 = vpmaxsd_avx2(auVar21,auVar22);
                  auVar22 = vpminsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar5));
                  auVar22 = vpmaxsd_avx2(auVar21,auVar22);
                  auVar21 = vpmaxsd_avx2(ZEXT1632(auVar6),ZEXT1632(auVar3));
                  auVar20 = vpmaxsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar4));
                  auVar23 = vpminsd_avx2(auVar21,auVar20);
                  auVar21 = vpmaxsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar5));
                  auVar20 = vpmaxsd_avx2(auVar22,auVar33._0_32_);
                  auVar21 = vpminsd_avx2(auVar21,local_5940);
                  auVar21 = vpminsd_avx2(auVar23,auVar21);
                  auVar21 = vcmpps_avx(auVar20,auVar21,2);
                  if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar21 >> 0x7f,0) != '\0') ||
                        (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar21 >> 0xbf,0) != '\0') ||
                      (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar21[0x1f] < '\0') {
                    auVar21 = vblendvps_avx(auVar32._0_32_,auVar22,auVar21);
                    auVar18 = auVar19._0_32_;
                    auVar22 = vcmpps_avx(auVar21,auVar18,1);
                    uVar11 = uVar13;
                    auVar23 = auVar18;
                    auVar20 = auVar21;
                    if (((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                              (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            SUB321(auVar22 >> 0x7f,0) == '\0') &&
                           (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          SUB321(auVar22 >> 0xbf,0) == '\0') &&
                         (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         -1 < auVar22[0x1f]) ||
                       (bVar17 = uVar12 != 8, uVar11 = uVar12, uVar12 = uVar13, auVar23 = auVar21,
                       auVar20 = auVar18, bVar17)) {
                      auVar21 = auVar23;
                      uVar9 = uVar9 + 1;
                      *puVar14 = uVar11;
                      puVar14 = puVar14 + 1;
                      *pauVar15 = auVar20;
                      pauVar15 = pauVar15 + 1;
                      uVar13 = uVar12;
                    }
                    auVar19 = ZEXT3264(auVar21);
                    uVar12 = uVar13;
                  }
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 8);
                if (uVar12 == 8) goto LAB_00613320;
                uVar16 = uVar12;
                if (1 < uVar9) {
                  auVar21 = pauVar15[-2];
                  auVar22 = pauVar15[-1];
                  auVar23 = vcmpps_avx(auVar21,auVar22,1);
                  auVar20 = auVar22;
                  if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar23 >> 0x7f,0) != '\0') ||
                        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar23 >> 0xbf,0) != '\0') ||
                      (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar23[0x1f] < '\0') {
                    pauVar15[-2] = auVar22;
                    pauVar15[-1] = auVar21;
                    auVar6 = vpermilps_avx(*(undefined1 (*) [16])(puVar14 + -2),0x4e);
                    *(undefined1 (*) [16])(puVar14 + -2) = auVar6;
                    auVar20 = auVar21;
                    auVar21 = auVar22;
                  }
                  if (uVar9 != 2) {
                    auVar22 = pauVar15[-3];
                    auVar23 = vcmpps_avx(auVar22,auVar20,1);
                    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar23 >> 0x7f,0) != '\0') ||
                          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar23 >> 0xbf,0) != '\0') ||
                        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar23[0x1f] < '\0') {
                      pauVar15[-3] = auVar20;
                      pauVar15[-1] = auVar22;
                      uVar12 = puVar14[-3];
                      puVar14[-3] = puVar14[-1];
                      puVar14[-1] = uVar12;
                      auVar22 = auVar20;
                    }
                    auVar20 = vcmpps_avx(auVar22,auVar21,1);
                    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar20 >> 0x7f,0) != '\0') ||
                          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar20 >> 0xbf,0) != '\0') ||
                        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar20[0x1f] < '\0') {
                      pauVar15[-3] = auVar21;
                      pauVar15[-2] = auVar22;
                      auVar6 = vpermilps_avx(*(undefined1 (*) [16])(puVar14 + -3),0x4e);
                      *(undefined1 (*) [16])(puVar14 + -3) = auVar6;
                    }
                  }
                }
              }
              if (uVar16 == 0xfffffffffffffff8) {
                return;
              }
              local_5920 = (anon_union_32_3_898e2e57_for_vboolf_impl<8>_1)
                           vcmpps_avx(local_5940,auVar19._0_32_,6);
              if (((((((((undefined1  [32])local_5920 >> 0x1f & (undefined1  [32])0x1) !=
                        (undefined1  [32])0x0 ||
                       ((undefined1  [32])local_5920 >> 0x3f & (undefined1  [32])0x1) !=
                       (undefined1  [32])0x0) ||
                      ((undefined1  [32])local_5920 >> 0x5f & (undefined1  [32])0x1) !=
                      (undefined1  [32])0x0) ||
                     SUB321((undefined1  [32])local_5920 >> 0x7f,0) != '\0') ||
                    ((undefined1  [32])local_5920 & (undefined1  [32])0x100000000) !=
                    (undefined1  [32])0x0) || SUB321((undefined1  [32])local_5920 >> 0xbf,0) != '\0'
                   ) || ((undefined1  [32])local_5920 & (undefined1  [32])0x100000000) !=
                        (undefined1  [32])0x0) || local_5920.i[7]._3_1_ < '\0') {
                lVar10 = (ulong)((uint)uVar16 & 0xf) - 8;
                if (lVar10 != 0) {
                  prim = (Primitive *)(uVar16 & 0xfffffffffffffff0);
                  do {
                    InstanceIntersectorK<8>::intersect
                              ((vbool<8> *)&local_5920.field_1,&local_5951,ray,context,prim);
                    prim = prim + 1;
                    lVar10 = lVar10 + -1;
                    context = local_5948;
                    ray = local_5950;
                  } while (lVar10 != 0);
                  auVar32 = ZEXT3264(CONCAT428(0x7f800000,
                                               CONCAT424(0x7f800000,
                                                         CONCAT420(0x7f800000,
                                                                   CONCAT416(0x7f800000,
                                                                             CONCAT412(0x7f800000,
                                                                                       CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  auVar33 = ZEXT3264(local_5860);
                  auVar29 = ZEXT3264(local_5880);
                  auVar34 = ZEXT3264(local_58a0);
                  auVar31 = ZEXT3264(local_58c0);
                  auVar28 = ZEXT3264(local_58e0);
                  auVar35 = ZEXT3264(local_5900);
                }
                local_5940 = vblendvps_avx(local_5940,*(undefined1 (*) [32])(ray + 0x100),
                                           (undefined1  [32])local_5920);
              }
            }
LAB_00613320:
            uVar16 = puVar14[-1];
            puVar14 = puVar14 + -1;
          } while (uVar16 != 0xfffffffffffffff8);
        }
      }
    }
    else {
      intersectCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }